

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_callback_vhost_protocols_vhost(lws_vhost *vh,int reason,void *in,size_t len)

{
  lws_protocols *plVar1;
  int iVar2;
  lws *wsi;
  long lVar3;
  long lVar4;
  
  wsi = (lws *)lws_zalloc(0x498,"fake wsi");
  if (wsi == (lws *)0x0) {
    iVar2 = 1;
  }
  else {
    (wsi->a).context = vh->context;
    lws_vhost_bind_wsi(vh,wsi);
    lVar4 = -1;
    lVar3 = 0;
    do {
      lVar4 = lVar4 + 1;
      if (((wsi->a).vhost)->count_protocols <= lVar4) {
        iVar2 = 0;
        goto LAB_001176a6;
      }
      plVar1 = vh->protocols;
      (wsi->a).protocol = (lws_protocols *)((long)&plVar1->name + lVar3);
      iVar2 = (**(code **)((long)&plVar1->callback + lVar3))(wsi,reason,0,in,len);
      lVar3 = lVar3 + 0x38;
    } while (iVar2 == 0);
    iVar2 = 1;
LAB_001176a6:
    lws_realloc(wsi,0,"lws_free");
  }
  return iVar2;
}

Assistant:

int
lws_callback_vhost_protocols_vhost(struct lws_vhost *vh, int reason, void *in,
				   size_t len)
{
	int n;
	struct lws *wsi = lws_zalloc(sizeof(*wsi), "fake wsi");

	if (!wsi)
		return 1;

	wsi->a.context = vh->context;
	lws_vhost_bind_wsi(vh, wsi);

	for (n = 0; n < wsi->a.vhost->count_protocols; n++) {
		wsi->a.protocol = &vh->protocols[n];
		if (wsi->a.protocol->callback(wsi, (enum lws_callback_reasons)reason, NULL, in, len)) {
			lws_free(wsi);
			return 1;
		}
	}

	lws_free(wsi);

	return 0;
}